

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreaterThanTests.cpp
# Opt level: O2

void __thiscall IsGreaterThanTests::~IsGreaterThanTests(IsGreaterThanTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::GreaterThan(5)(12) is True", []()
		{
			AssertThat(ut11::Is::GreaterThan(5)(12), ut11::Is::True);
		});

		Then("Is::GreaterThan(5)(5) is False", []()
		{
			AssertThat(ut11::Is::GreaterThan(5)(5), ut11::Is::False);
		});

		Then("Is::GreaterThan(5)(3) is False", []()
		{
			AssertThat(ut11::Is::GreaterThan(5)(3), ut11::Is::False);
		});

		Then("Is::GreaterThan is an operand", []()
		{
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::GreaterThan(5)) >::value, ut11::Is::True);
		});

		Then("Is::GreaterThan has an error message", []() {
			AssertThat(ut11::Is::GreaterThan(5).GetErrorMessage(3), ut11::Is::Not::EqualTo(""));
		});
	}